

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_bio_cf_in_read(BIO *bio,char *buf,int blen)

{
  undefined8 *puVar1;
  CURLcode CVar2;
  Curl_cfilter *cf;
  ulong uVar3;
  Curl_easy *data;
  CURLcode result;
  undefined8 local_38;
  
  local_38._4_4_ = blen;
  cf = (Curl_cfilter *)BIO_get_data();
  uVar3 = 0;
  if (cf == (Curl_cfilter *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)((long)cf->ctx + 0x38);
  }
  puVar1 = *(undefined8 **)((long)cf->ctx + 0x30);
  local_38 = CONCAT44(local_38._4_4_,0x38);
  if (buf != (char *)0x0) {
    uVar3 = Curl_conn_cf_recv(cf->next,data,buf,(long)local_38._4_4_,(CURLcode *)&local_38);
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_bio_cf_in_read(len=%d) -> %d, err=%d",local_38 >> 0x20,
                        uVar3 & 0xffffffff,local_38 & 0xffffffff);
    }
    BIO_clear_flags((BIO *)bio,0xf);
    *(CURLcode *)(puVar1 + 4) = (CURLcode)local_38;
    if ((CURLcode)local_38 == CURLE_AGAIN && (long)uVar3 < 0) {
      BIO_set_flags((BIO *)bio,9);
    }
    if (*(char *)((long)puVar1 + 0x24) == '\0') {
      CVar2 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar1);
      if (CVar2 == CURLE_OK) {
        *(undefined1 *)((long)puVar1 + 0x24) = 1;
      }
      else {
        *(CURLcode *)(puVar1 + 4) = CVar2;
        uVar3 = 0xffffffff;
      }
    }
  }
  return (int)uVar3;
}

Assistant:

static int ossl_bio_cf_in_read(BIO *bio, char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nread;
  CURLcode result = CURLE_RECV_ERROR;

  DEBUGASSERT(data);
  /* OpenSSL catches this case, so should we. */
  if(!buf)
    return 0;

  nread = Curl_conn_cf_recv(cf->next, data, buf, blen, &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_in_read(len=%d) -> %d, err=%d",
              blen, (int)nread, result);
  BIO_clear_retry_flags(bio);
  backend->io_result = result;
  if(nread < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_read(bio);
  }

  /* Before returning server replies to the SSL instance, we need
   * to have setup the x509 store or verification will fail. */
  if(!backend->x509_store_setup) {
    result = Curl_ssl_setup_x509_store(cf, data, backend->ctx);
    if(result) {
      backend->io_result = result;
      return -1;
    }
    backend->x509_store_setup = TRUE;
  }

  return (int)nread;
}